

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEDate.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * CEDate::Gregorian2GregorianVect(double gregorian)

{
  reference pvVar1;
  vector<double,_std::allocator<double>_> *in_RDI;
  double in_XMM0_Qa;
  double __x;
  double dVar2;
  double greg;
  vector<double,_std::allocator<double>_> *gregorian_vect;
  allocator_type *in_stack_ffffffffffffff68;
  value_type *in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff78;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff80;
  
  std::allocator<double>::allocator((allocator<double> *)0x13cedb);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  std::allocator<double>::~allocator((allocator<double> *)0x13cf06);
  __x = ABS(in_XMM0_Qa);
  dVar2 = floor(__x);
  dVar2 = __x - dVar2;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,3);
  *pvVar1 = dVar2;
  dVar2 = floor(__x);
  dVar2 = (double)((int)dVar2 % 100);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,2);
  *pvVar1 = dVar2;
  dVar2 = __x;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,2);
  dVar2 = floor(dVar2 - *pvVar1);
  dVar2 = (double)((int)(dVar2 / 100.0) % 100);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,1);
  *pvVar1 = dVar2;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,2);
  dVar2 = *pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,1);
  dVar2 = floor(*pvVar1 * -100.0 + (__x - dVar2));
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,0);
  *pvVar1 = (double)(int)(dVar2 / 10000.0);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,0);
  *pvVar1 = (double)(~-(ulong)(in_XMM0_Qa < 0.0) & 0x3ff0000000000000 |
                    (ulong)((uint)(-(ulong)(in_XMM0_Qa < 0.0) >> 0x20) & 0xbff00000) << 0x20) *
            *pvVar1;
  return in_RDI;
}

Assistant:

std::vector<double> CEDate::Gregorian2GregorianVect(double gregorian)
{
    // Create a vector to hold the information
    std::vector<double> gregorian_vect(4,0.0) ;
    double greg = std::fabs(gregorian);

    // Get the day fraction
    gregorian_vect[3] = greg - std::floor(greg);
    // Get the day of the month
    gregorian_vect[2] = int(std::floor(greg)) % 100 ;
    // Get the month
    gregorian_vect[1] = int(std::floor(greg - gregorian_vect[2])/100) % 100;
    // Get the year
    gregorian_vect[0] = int(std::floor(greg - gregorian_vect[2] - 100*gregorian_vect[1]) / 10000);
    gregorian_vect[0] *= (gregorian < 0.0) ? -1.0 : 1.0;

    return gregorian_vect;
}